

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O3

void __thiscall
AV1Kmeans::AV1KmeansTest1_CheckOutput_Test::~AV1KmeansTest1_CheckOutput_Test
          (AV1KmeansTest1_CheckOutput_Test *this)

{
  CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int> *this_00;
  
  this_00 = (CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int> *
            )(this[-1].super_AV1KmeansTest1.indices2_ + 0xff4);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

TEST_P(AV1KmeansTest1, CheckOutput) {
  // centroids = 2..8
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 2);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 3);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 4);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 5);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 6);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 7);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 8);
}